

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall
choc::value::Value::importStringHandles(choc::value::ValueView&,choc::value::
StringDictionary_const&)::StringHandleImporter::importStrings(choc::value::ValueView__
          (void *this,ValueView *v)

{
  MainType MVar1;
  uint32_t uVar2;
  StringDictionary *pSVar3;
  ComplexArray *pCVar4;
  Allocator *pAVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  ulong uVar9;
  uint32_t index;
  long lVar10;
  ValueView member;
  ValueView element;
  ValueView local_c0;
  uint32_t local_90;
  uint32_t local_8c;
  ValueView local_88;
  ElementTypeAndOffset local_58;
  
  MVar1 = (v->type).mainType;
  if (MVar1 == string) {
LAB_001e4f58:
    pSVar3 = v->stringDictionary;
    uVar8 = (**(code **)(**this + 0x18))(*this,*(undefined4 *)v->data);
    iVar7 = (*pSVar3->_vptr_StringDictionary[2])(pSVar3,uVar8);
    *(int *)v->data = iVar7;
    return;
  }
  if (MVar1 != object) {
    return;
  }
  bVar6 = Type::Object::usesStrings((v->type).content.object);
  if (!bVar6) {
    return;
  }
  MVar1 = (v->type).mainType;
  if (MVar1 < complexArray) {
    if (MVar1 == string) goto LAB_001e4f58;
    if (MVar1 != primitiveArray) {
      return;
    }
  }
  else if (MVar1 != complexArray) {
    if (MVar1 != object) {
      return;
    }
    uVar2 = (((v->type).content.object)->members).size;
    if (uVar2 == 0) {
      return;
    }
    index = 0;
    do {
      Type::getElementTypeAndOffset((ElementTypeAndOffset *)&local_88,&v->type,index);
      local_c0.stringDictionary = v->stringDictionary;
      local_c0.data = v->data + (long)local_88.data;
      local_c0.type.mainType = local_88.type.mainType;
      local_c0.type.content.object = local_88.type.content.object;
      local_c0.type.content._8_8_ = local_88.type.content._8_8_;
      local_c0.type.allocator = local_88.type.allocator;
      ValueView__(this,&local_c0);
      pAVar5 = local_c0.type.allocator;
      uVar8 = local_c0.type.content.object;
      if ((char)local_c0.type.mainType < '\0') {
        if (local_c0.type.mainType == object) {
          if (local_c0.type.content.object != (Object *)0x0) {
            Type::Object::~Object(local_c0.type.content.object);
            goto LAB_001e5059;
          }
        }
        else if ((local_c0.type.mainType == complexArray) &&
                (local_c0.type.content.object != (Object *)0x0)) {
          Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                    ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                     local_c0.type.content.object);
LAB_001e5059:
          if (pAVar5 == (Allocator *)0x0) {
            free((void *)uVar8);
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x20))(pAVar5,uVar8);
          }
        }
      }
      index = index + 1;
      if (uVar2 == index) {
        return;
      }
    } while( true );
  }
  ValueView::ValueView(&local_c0,v);
  local_90 = 0;
  MVar1 = (v->type).mainType;
  uVar9 = (ulong)(MVar1 - 1);
  if (MVar1 - 1 < 0x40) {
    if ((0x800880089U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((uVar9 != 0x2f) && (uVar9 != 0x3f)) goto LAB_001e50cb;
      local_8c = (v->type).content.vector.numElements;
      goto LAB_001e5111;
    }
    local_8c = 1;
  }
  else {
LAB_001e50cb:
    if (MVar1 == complexArray) {
      pCVar4 = (v->type).content.complexArray;
      uVar9 = (ulong)(pCVar4->groups).size;
      if (uVar9 == 0) {
        local_8c = 0;
        goto LAB_001e520a;
      }
      lVar10 = 0;
      local_8c = 0;
      do {
        local_8c = local_8c + *(int *)((long)&((pCVar4->groups).items)->repetitions + lVar10);
        lVar10 = lVar10 + 0x28;
      } while (uVar9 * 0x28 != lVar10);
    }
    else {
      if (MVar1 != object) {
        throwError("This type doesn\'t have sub-elements");
      }
      local_8c = (((v->type).content.object)->members).size;
    }
LAB_001e5111:
    if (local_8c == 0) goto LAB_001e520a;
  }
  do {
    Type::getElementTypeAndOffset(&local_58,&local_c0.type,local_90);
    local_88.data = local_c0.data + local_58.offset;
    local_88.type.mainType = local_58.elementType.mainType;
    local_88.type.content.object = local_58.elementType.content.object;
    local_88.type.content._8_8_ = local_58.elementType.content._8_8_;
    local_88.type.allocator = local_58.elementType.allocator;
    local_88.stringDictionary = local_c0.stringDictionary;
    ValueView__(this,&local_88);
    pAVar5 = local_88.type.allocator;
    uVar8 = local_88.type.content.object;
    if ((char)local_88.type.mainType < '\0') {
      if (local_88.type.mainType == object) {
        if (local_88.type.content.object != (Object *)0x0) {
          Type::Object::~Object(local_88.type.content.object);
          goto LAB_001e51df;
        }
      }
      else if ((local_88.type.mainType == complexArray) &&
              (local_88.type.content.object != (Object *)0x0)) {
        Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                  ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                   local_88.type.content.object);
LAB_001e51df:
        if (pAVar5 == (Allocator *)0x0) {
          free((void *)uVar8);
        }
        else {
          (**(code **)(*(long *)pAVar5 + 0x20))(pAVar5,uVar8);
        }
      }
    }
    local_90 = local_90 + 1;
  } while (local_90 != local_8c);
LAB_001e520a:
  if ((char)local_c0.type.mainType < '\0') {
    if (local_c0.type.mainType == object) {
      if (local_c0.type.content.object == (Object *)0x0) {
        return;
      }
      Type::Object::~Object(local_c0.type.content.object);
    }
    else {
      if (local_c0.type.mainType != complexArray) {
        return;
      }
      if (local_c0.type.content.object == (Object *)0x0) {
        return;
      }
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_c0.type.content.object);
    }
    if (local_c0.type.allocator == (Allocator *)0x0) {
      free(local_c0.type.content.object);
    }
    else {
      (**(code **)(*(long *)local_c0.type.allocator + 0x20))
                (local_c0.type.allocator,local_c0.type.content.object);
    }
  }
  return;
}

Assistant:

void importStrings (ValueView& v)
        {
            if (v.getType().usesStrings())
            {
                if (v.isString())
                {
                    auto oldHandle = StringDictionary::Handle { v.readContentAs<decltype (StringDictionary::Handle::handle)>() };
                    v.setUnchecked (v.stringDictionary->getHandleForString (oldDic.getStringForHandle (oldHandle)));
                }
                else if (v.isArray())
                {
                    for (auto element : v)
                        importStrings (element);
                }
                else if (v.isObject())
                {
                    auto numMembers = v.size();

                    for (uint32_t i = 0; i < numMembers; ++i)
                    {
                        auto member = v[i];
                        importStrings (member);
                    }
                }
            }
        }